

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.cpp
# Opt level: O2

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  char from;
  char to;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  lconv *plVar8;
  TString *pTVar9;
  uint c;
  char *pcVar10;
  long lVar11;
  uint local_44 [3];
  SemInfo *local_38;
  
  ls->buff->n = 0;
LAB_0010f17a:
  uVar4 = ls->current;
  switch(uVar4) {
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    goto LAB_0010f17a;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_0010f17a;
  case 0x22:
  case 0x27:
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    local_38 = seminfo;
    goto LAB_0010f581;
  case 0x2d:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x2d) {
      return 0x2d;
    }
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 == 0x5b) {
      iVar7 = skip_sep(ls);
      ls->buff->n = 0;
      if (iVar7 < 0) {
        uVar4 = ls->current;
        goto LAB_0010f268;
      }
      read_long_string(ls,(SemInfo *)0x0,iVar7);
      ls->buff->n = 0;
    }
    else {
LAB_0010f268:
      while ((0xe < uVar4 + 1 || ((0x4801U >> (uVar4 + 1 & 0x1f) & 1) == 0))) {
        pZVar2 = ls->z;
        sVar1 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar1 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      }
    }
    goto LAB_0010f17a;
  case 0x2e:
    save(ls,0x2e);
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = check_next(ls,".");
    if (iVar7 != 0) {
      iVar7 = check_next(ls,".");
      return 0x118 - (uint)(iVar7 == 0);
    }
    uVar4 = ls->current;
    if ((""[(long)(int)uVar4 + 1] & 2) == 0) {
      return 0x2e;
    }
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    break;
  case 0x3a:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x3a) {
      return 0x3a;
    }
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    return 0x11d;
  case 0x3c:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x3d) {
      return 0x3c;
    }
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    return 0x11b;
  case 0x3d:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x3d) {
      return 0x3d;
    }
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    return 0x119;
  case 0x3e:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x3d) {
      return 0x3e;
    }
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    return 0x11a;
  default:
    if (uVar4 == 0xffffffff) {
      return 0x11e;
    }
    if (uVar4 == 0x5b) {
      iVar7 = skip_sep(ls);
      if (-1 < iVar7) {
        read_long_string(ls,seminfo,iVar7);
        return 0x121;
      }
      if (iVar7 == -1) {
        return 0x5b;
      }
      goto LAB_0010fb28;
    }
    if (uVar4 == 0x7e) {
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
      if (uVar4 == 0x3d) {
        pZVar2 = ls->z;
        sVar1 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar1 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
        return 0x11c;
      }
      return 0x7e;
    }
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2f:
  case 0x3b:
    if ((""[(long)(int)uVar4 + 1] & 1) == 0) {
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
      return uVar4;
    }
    do {
      save(ls,uVar4);
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
    } while ((""[(long)(int)uVar4 + 1] & 3) != 0);
    pTVar9 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
    seminfo->ts = pTVar9;
    if ((pTVar9->tsv).tt == '\x04') {
      if ((pTVar9->tsv).extra != 0) {
        return (pTVar9->tsv).extra | 0x100;
      }
      return 0x120;
    }
    return 0x120;
  }
  save(ls,uVar4);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar5 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar5 = (uint)*pbVar3;
  }
  ls->current = uVar5;
  if (uVar4 == 0x30) {
    iVar7 = check_next(ls,"Xx");
    pcVar10 = "Pp";
    if (iVar7 == 0) {
      pcVar10 = "Ee";
    }
  }
  else {
    pcVar10 = "Ee";
  }
  while( true ) {
    iVar7 = check_next(ls,pcVar10);
    if (iVar7 != 0) {
      check_next(ls,"+-");
    }
    iVar7 = ls->current;
    if (((long)iVar7 != 0x2e) && ((""[(long)iVar7 + 1] & 0x10) == 0)) break;
    save(ls,iVar7);
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
  }
  save(ls,0);
  buffreplace(ls,'.',ls->decpoint);
  iVar7 = luaO_str2d(ls->buff->buffer,ls->buff->n - 1,&seminfo->r);
  if (iVar7 == 0) {
    from = ls->decpoint;
    plVar8 = localeconv();
    to = *plVar8->decimal_point;
    ls->decpoint = to;
    buffreplace(ls,from,to);
    iVar7 = luaO_str2d(ls->buff->buffer,ls->buff->n - 1,&seminfo->r);
    if (iVar7 == 0) {
      buffreplace(ls,ls->decpoint,'.');
      lexerror(ls,"malformed number",0x11f);
    }
    return 0x11f;
  }
  return 0x11f;
LAB_0010f581:
  do {
    if (uVar5 == uVar4) {
      save(ls,uVar4);
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
      pTVar9 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
      seminfo->ts = pTVar9;
      return 0x121;
    }
    if (uVar5 == 0x5c) {
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
      switch(uVar5) {
      case 0x6e:
        c = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
      case 0x79:
        goto switchD_0010f68f_caseD_6f;
      case 0x72:
        c = 0xd;
        break;
      case 0x74:
        c = 9;
        break;
      case 0x76:
        c = 0xb;
        break;
      case 0x78:
        local_44[0] = 0x78;
        c = 0;
        for (lVar11 = 1; lVar11 != 3; lVar11 = lVar11 + 1) {
          pZVar2 = ls->z;
          sVar1 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar1 == 0) {
            uVar5 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          ls->current = uVar5;
          local_44[lVar11] = uVar5;
          if ((""[(long)(int)uVar5 + 1] & 0x10) == 0) {
            escerror(ls,(int *)local_44,(int)lVar11 + 1,"hexadecimal digit expected");
            goto LAB_0010fad4;
          }
          iVar7 = luaO_hexavalue(uVar5);
          c = c * 0x10 + iVar7;
        }
        break;
      case 0x7a:
        do {
          pZVar2 = ls->z;
          sVar1 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar1 == 0) {
            uVar5 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          ls->current = uVar5;
          while( true ) {
            if ((""[(long)(int)uVar5 + 1] & 8) == 0) goto LAB_0010f581;
            if ((uVar5 != 0xd) && (uVar5 != 10)) break;
            inclinenumber(ls);
            uVar5 = ls->current;
          }
        } while( true );
      default:
        goto switchD_0010f68f_default;
      }
      goto LAB_0010f7cf;
    }
    if ((uVar5 == 0xd) || (uVar5 == 10)) {
LAB_0010fad4:
      pcVar10 = "unfinished string";
      goto LAB_0010fadb;
    }
    if (uVar5 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x11e);
    }
    save(ls,uVar5);
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
  } while( true );
switchD_0010f68f_default:
  if (uVar5 == 0xffffffff) goto LAB_0010f581;
  if ((uVar5 == 10) || (uVar5 == 0xd)) {
    inclinenumber(ls);
    c = 10;
  }
  else {
    c = uVar5;
    if ((((uVar5 != 0x22) && (uVar5 != 0x27)) && (uVar5 != 0x5c)) && (c = 7, uVar5 != 0x61)) {
      if (uVar5 == 0x66) {
        c = 0xc;
      }
      else {
        if (uVar5 != 0x62) {
switchD_0010f68f_caseD_6f:
          if ((""[(long)(int)uVar5 + 1] & 2) != 0) {
            c = 0;
            for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
              if ((""[(long)(int)uVar5 + 1] & 2) == 0) goto LAB_0010f809;
              local_44[lVar11] = uVar5;
              pZVar2 = ls->z;
              sVar1 = pZVar2->n;
              pZVar2->n = pZVar2->n - 1;
              if (sVar1 == 0) {
                uVar6 = luaZ_fill(pZVar2);
              }
              else {
                pbVar3 = (byte *)pZVar2->p;
                pZVar2->p = (char *)(pbVar3 + 1);
                uVar6 = (uint)*pbVar3;
              }
              c = (uVar5 + c * 10) - 0x30;
              ls->current = uVar6;
              uVar5 = uVar6;
            }
            lVar11 = 3;
LAB_0010f809:
            seminfo = local_38;
            if ((int)c < 0x100) goto LAB_0010f7f1;
            escerror(ls,(int *)local_44,(int)lVar11,"decimal escape too large");
          }
          escerror(ls,&ls->current,1,"invalid escape sequence");
LAB_0010fb28:
          pcVar10 = "invalid long string delimiter";
LAB_0010fadb:
          lexerror(ls,pcVar10,0x121);
        }
        c = 8;
      }
    }
LAB_0010f7cf:
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
  }
LAB_0010f7f1:
  save(ls,c);
  uVar5 = ls->current;
  goto LAB_0010f581;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          int sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* `skip_sep' may dirty the buffer */
          if (sep >= 0) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        int sep = skip_sep(ls);
        if (sep >= 0) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == -1) return '[';
        else lexerror(ls, "invalid long string delimiter", TK_STRING);
      }
      case '=': {
        next(ls);
        if (ls->current != '=') return '=';
        else { next(ls); return TK_EQ; }
      }
      case '<': {
        next(ls);
        if (ls->current != '=') return '<';
        else { next(ls); return TK_LE; }
      }
      case '>': {
        next(ls);
        if (ls->current != '=') return '>';
        else { next(ls); return TK_GE; }
      }
      case '~': {
        next(ls);
        if (ls->current != '=') return '~';
        else { next(ls); return TK_NE; }
      }
      case ':': {
        next(ls);
        if (ls->current != ':') return ':';
        else { next(ls); return TK_DBCOLON; }
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next(ls, ".")) {
          if (check_next(ls, "."))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        /* else go through */
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        read_numeral(ls, seminfo);
        return TK_NUMBER;
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->tsv.extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}